

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

bitwidth_t __thiscall slang::SVInt::countLeadingOnesSlowCase(SVInt *this)

{
  uint64_t *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = (this->super_SVIntStorage).bitWidth;
  uVar7 = uVar3 & 0x3f;
  uVar6 = (uVar3 + 0x3f >> 6) << ((this->super_SVIntStorage).unknownFlag & 0x1fU);
  bVar5 = 0x40 - (char)uVar7;
  uVar3 = 0x40;
  if (uVar7 != 0) {
    uVar3 = uVar7;
  }
  puVar1 = (this->super_SVIntStorage).field_0.pVal;
  if (uVar7 == 0) {
    bVar5 = 0;
  }
  uVar4 = puVar1[(ulong)uVar6 - 1] << (bVar5 & 0x3f) ^ 0xffffffffffffffff;
  if (uVar4 == 0) {
    uVar7 = 0x40;
  }
  else {
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar7 = (uint)lVar2 ^ 0x3f;
  }
  if (uVar3 == uVar7) {
    uVar7 = uVar3;
    for (uVar6 = uVar6 - 2; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      uVar4 = puVar1[uVar6];
      if (uVar4 != 0xffffffffffffffff) {
        uVar4 = uVar4 ^ 0xffffffffffffffff;
        if (uVar4 == 0) {
          uVar3 = 0x40;
        }
        else {
          lVar2 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar3 = (uint)lVar2 ^ 0x3f;
        }
        return uVar3 + uVar7;
      }
      uVar7 = uVar7 + 0x40;
    }
  }
  return uVar7;
}

Assistant:

bitwidth_t SVInt::countLeadingOnesSlowCase() const {
    bitwidth_t bitsInMsw = bitWidth % BITS_PER_WORD;
    uint32_t shift = 0;
    if (!bitsInMsw)
        bitsInMsw = BITS_PER_WORD;
    else
        shift = BITS_PER_WORD - bitsInMsw;

    int i = int(getNumWords() - 1);
    bitwidth_t count = (bitwidth_t)std::countl_one(pVal[i] << shift);
    if (count == bitsInMsw) {
        for (i--; i >= 0; i--) {
            if (pVal[i] == UINT64_MAX)
                count += BITS_PER_WORD;
            else {
                count += (bitwidth_t)std::countl_one(pVal[i]);
                break;
            }
        }
    }

    return count;
}